

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzv3dmesh.cpp
# Opt level: O2

void __thiscall TPZV3DGraphMesh::SequenceNodes(TPZV3DGraphMesh *this)

{
  TPZGraphNode *this_00;
  int64_t iVar1;
  long lVar2;
  long nelem;
  
  TPZGraphMesh::SequenceNodes(&this->super_TPZGraphMesh);
  lVar2 = (this->super_TPZGraphMesh).fNodeMap.super_TPZChunkVector<TPZGraphNode,_10>.fNElements;
  nelem = 0;
  if (lVar2 < 1) {
    lVar2 = nelem;
  }
  for (; lVar2 != nelem; nelem = nelem + 1) {
    this_00 = TPZChunkVector<TPZGraphNode,_10>::operator[]
                        (&(this->super_TPZGraphMesh).fNodeMap.super_TPZChunkVector<TPZGraphNode,_10>
                         ,nelem);
    iVar1 = TPZGraphNode::FirstPoint(this_00);
    TPZGraphNode::SetPointNumber(this_00,iVar1 + 1);
  }
  return;
}

Assistant:

void TPZV3DGraphMesh::SequenceNodes(){
	TPZGraphMesh::SequenceNodes();
	int64_t nnod = fNodeMap.NElements();
	for(int64_t i=0;i<nnod;i++) {
		TPZGraphNode *n = &fNodeMap[i];
		if(n) n->SetPointNumber(n->FirstPoint()+1);
	}
}